

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::destruct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::BreakpointEvent> *this_local;
  
  BreakpointEvent::~BreakpointEvent((BreakpointEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }